

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O3

void __thiscall QMimeXMLProvider::addParent(QMimeXMLProvider *this,QString *child,QString *parent)

{
  byte bVar1;
  Entry *pEVar2;
  uchar *this_00;
  long in_FS_OFFSET;
  TryEmplaceResult local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QHash<QString,QList<QString>>::tryEmplace_impl<QString_const&>
            (&local_30,(QHash<QString,QList<QString>> *)&this->m_parents,child);
  pEVar2 = (local_30.iterator.i.d)->spans[local_30.iterator.i.bucket >> 7].entries;
  bVar1 = (local_30.iterator.i.d)->spans[local_30.iterator.i.bucket >> 7].offsets
          [(uint)local_30.iterator.i.bucket & 0x7f];
  this_00 = (pEVar2->storage).data + (ulong)((uint)bVar1 * 0x30) + 0x18;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)this_00,
             *(qsizetype *)((pEVar2->storage).data + (ulong)((uint)bVar1 * 0x30) + 0x28),parent);
  QList<QString>::end((QList<QString> *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMimeXMLProvider::addParent(const QString &child, const QString &parent)
{
    m_parents[child].append(parent);
}